

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_dynamic_state<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info,ScratchAllocator *alloc,
          DynamicStateInfo *param_3)

{
  VkPipelineDynamicStateCreateInfo *pVVar1;
  VkDynamicState *pVVar2;
  allocator local_51;
  string local_50;
  DynamicStateInfo *local_30;
  DynamicStateInfo *param_3_local;
  ScratchAllocator *alloc_local;
  VkGraphicsPipelineCreateInfo *info_local;
  Impl *this_local;
  
  local_30 = param_3;
  param_3_local = (DynamicStateInfo *)alloc;
  alloc_local = (ScratchAllocator *)info;
  info_local = (VkGraphicsPipelineCreateInfo *)this;
  if (info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    if (info->pDynamicState->pNext != (void *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_50,"pNext in VkPipelineDynamicStateCreateInfo not supported.",
                 &local_51);
      log_error_pnext_chain
                (&local_50,
                 ((alloc_local[0xc].impl)->blocks).
                 super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      return false;
    }
    pVVar1 = copy<VkPipelineDynamicStateCreateInfo>(this,info->pDynamicState,1,alloc);
    alloc_local[0xc].impl = (Impl *)pVVar1;
  }
  if (alloc_local[0xc].impl != (Impl *)0x0) {
    pVVar2 = copy<VkDynamicState>
                       (this,(VkDynamicState *)(alloc_local[0xc].impl)->peak_history_size,
                        (ulong)*(uint *)((long)&((alloc_local[0xc].impl)->blocks).
                                                super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),(ScratchAllocator *)param_3_local);
    (alloc_local[0xc].impl)->peak_history_size = (size_t)pVVar2;
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_dynamic_state(CreateInfo *info, ScratchAllocator &alloc,
                                             const DynamicStateInfo *)
{
	if (info->pDynamicState)
	{
		if (info->pDynamicState->pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineDynamicStateCreateInfo not supported.",
								  info->pDynamicState->pNext);
			return false;
		}
		info->pDynamicState = copy(info->pDynamicState, 1, alloc);
	}

	if (info->pDynamicState)
	{
		const_cast<VkPipelineDynamicStateCreateInfo *>(info->pDynamicState)->pDynamicStates =
				copy(info->pDynamicState->pDynamicStates, info->pDynamicState->dynamicStateCount, alloc);
	}

	return true;
}